

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

void __thiscall wabt::interp::Thread::Mark(Thread *this,Store *store)

{
  ulong *puVar1;
  pointer pFVar2;
  _Bit_type *p_Var3;
  ulong uVar4;
  uint *puVar5;
  pointer pVVar6;
  Frame *frame;
  pointer pFVar7;
  uint *puVar8;
  ulong uVar9;
  
  pFVar7 = (this->frames_).
           super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar2 = (this->frames_).
           super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pFVar7 != pFVar2) {
    p_Var3 = (store->marks_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    do {
      uVar4 = (pFVar7->func).index;
      uVar9 = uVar4 + 0x3f;
      if (-1 < (long)uVar4) {
        uVar9 = uVar4;
      }
      puVar1 = p_Var3 + ((long)uVar9 >> 6) +
                        (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001) +
                        0xffffffffffffffff;
      *puVar1 = *puVar1 | 1L << ((byte)uVar4 & 0x3f);
      pFVar7 = pFVar7 + 1;
    } while (pFVar7 != pFVar2);
  }
  puVar8 = (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar8 != puVar5) {
    pVVar6 = (this->values_).
             super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var3 = (store->marks_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    do {
      uVar4 = pVVar6[*puVar8].i64_;
      uVar9 = uVar4 + 0x3f;
      if (-1 < (long)uVar4) {
        uVar9 = uVar4;
      }
      puVar1 = p_Var3 + ((long)uVar9 >> 6) +
                        (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001) +
                        0xffffffffffffffff;
      *puVar1 = *puVar1 | 1L << ((byte)uVar4 & 0x3f);
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar5);
  }
  return;
}

Assistant:

void Thread::Mark(Store& store) {
  for (auto&& frame : frames_) {
    frame.Mark(store);
  }
  for (auto index: refs_) {
    store.Mark(values_[index].ref_);
  }
}